

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O3

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::MarkAlgConDeleted
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int con_index)

{
  _Bit_type *p_Var1;
  int iVar2;
  
  p_Var1 = (this->is_alg_con_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if ((ulong)(this->is_alg_con_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->is_alg_con_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var1) * 8 <=
      (ulong)(long)con_index) {
    std::vector<bool,_std::allocator<bool>_>::resize
              (&this->is_alg_con_deleted_,
               (long)((int)((ulong)((long)(this->algebraic_cons_).
                                          super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->algebraic_cons_).
                                         super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0xf0f0f0f),false);
    p_Var1 = (this->is_alg_con_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  }
  iVar2 = con_index + 0x3f;
  if (-1 < con_index) {
    iVar2 = con_index;
  }
  p_Var1[(long)(iVar2 >> 6) +
         (ulong)(((long)con_index & 0x800000000000003fU) < 0x8000000000000001) + 0xffffffffffffffff]
       = p_Var1[(long)(iVar2 >> 6) +
                (ulong)(((long)con_index & 0x800000000000003fU) < 0x8000000000000001) +
                0xffffffffffffffff] | 1L << ((byte)con_index & 0x3f);
  return;
}

Assistant:

LinearExpr &linear_expr() const {
      return this->problem_->algebraic_cons_[this->index_].linear_expr;
    }